

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::DecodeDataBuilder::AddFirst
          (DecodeDataBuilder *this,char desired,char input)

{
  char cVar1;
  uint8_t uVar2;
  
  if (desired == input) {
    uVar2 = '\0';
  }
  else {
    cVar1 = input + -0x20;
    if (0x19 < (byte)(input + 0x9fU)) {
      cVar1 = input;
    }
    uVar2 = '@';
    if (cVar1 != desired) {
      if ((byte)(input + 0xbfU) < 0x1a) {
        input = input + ' ';
      }
      uVar2 = ' ';
      if (input != desired) {
        return false;
      }
    }
  }
  this->op_ = uVar2;
  AddChar(this,desired);
  return true;
}

Assistant:

bool AddFirst(const char desired, const char input) {
    if (desired == input) {
      op_ = kOpAsIs;
    } else if (desired == ascii_toupper(input)) {
      op_ = kOpFirstUpper;
    } else if (desired == ascii_tolower(input)) {
      op_ = kOpFirstLower;
    } else {
      // Can't be transformed to match.
      return false;
    }
    AddChar(desired);
    return true;
  }